

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O1

void __thiscall five_point_solver::advance_e(five_point_solver *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar31;
  int iVar32;
  field3d<celle> *pfVar33;
  celle *pcVar34;
  cellb **ppcVar35;
  cellb *pcVar36;
  cellb *pcVar37;
  cellj *pcVar38;
  field3d<cellb> *pfVar39;
  cellb ***pppcVar40;
  field3d<cellj> *pfVar41;
  celle **ppcVar42;
  cellb **ppcVar43;
  cellb **ppcVar44;
  cellb **ppcVar45;
  cellj **ppcVar46;
  long lVar47;
  long lVar48;
  byte bVar49;
  bool bVar50;
  ulong uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar128 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar101 [64];
  undefined1 auVar98 [64];
  undefined1 auVar108 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar129 [64];
  
  pfVar33 = (this->super_maxwell_solver).ce;
  iVar30 = pfVar33->nx;
  iVar31 = pfVar33->ny;
  iVar32 = pfVar33->nz;
  uVar55 = (ulong)(iVar30 - 2);
  if (4 < iVar30) {
    auVar74 = vpbroadcastq_avx512f();
    uVar57 = 2;
    auVar65._8_8_ = 0x8000000000000000;
    auVar65._0_8_ = 0x8000000000000000;
    auVar75 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar76 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar77 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (4 < iVar31) {
        auVar60._8_8_ = 0;
        auVar60._0_8_ = (this->super_maxwell_solver).dtdz;
        auVar78 = vbroadcastsd_avx512f(auVar60);
        auVar134._0_8_ = auVar78._0_8_ ^ 0x8000000000000000;
        auVar134._8_8_ = auVar78._8_8_ ^ 0x8000000000000000;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = (this->super_maxwell_solver).dtdx;
        auVar79 = vbroadcastsd_avx512f(auVar61);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (this->super_maxwell_solver).dtdy;
        in_ZMM17 = vbroadcastsd_avx512f(auVar6);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = this->ay;
        auVar80 = vbroadcastsd_avx512f(auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = this->by;
        auVar81 = vbroadcastsd_avx512f(auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->az;
        auVar82 = vbroadcastsd_avx512f(auVar9);
        auVar60 = vxorpd_avx512vl(auVar79._0_16_,auVar65);
        in_ZMM18 = ZEXT1664(auVar60);
        auVar61 = vxorpd_avx512vl(in_ZMM17._0_16_,auVar65);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->bz;
        auVar83 = vbroadcastsd_avx512f(auVar10);
        in_ZMM19 = vbroadcastsd_avx512f(auVar134);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (this->super_maxwell_solver).dx;
        in_ZMM22 = vbroadcastsd_avx512f(auVar11);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = this->ax;
        auVar84 = vbroadcastsd_avx512f(auVar12);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = this->bx;
        auVar85 = vbroadcastsd_avx512f(auVar13);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = (this->super_maxwell_solver).dy;
        auVar86 = vbroadcastsd_avx512f(auVar14);
        auVar87 = vbroadcastsd_avx512f(auVar60);
        in_ZMM20 = vbroadcastsd_avx512f(auVar61);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (this->super_maxwell_solver).dz;
        auVar88 = vbroadcastsd_avx512f(auVar15);
        uVar58 = 2;
        do {
          if (4 < iVar32) {
            pcVar34 = (pfVar33->p)._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar57][uVar58];
            ppcVar35 = (((this->super_maxwell_solver).cb)->p)._M_t.
                       super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                       super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar57];
            pcVar36 = ppcVar35[uVar58];
            pcVar37 = ppcVar35[uVar58 + 1];
            pcVar38 = (((this->super_maxwell_solver).cj)->p)._M_t.
                      super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                      super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar57][uVar58];
            auVar89 = vpbroadcastq_avx512f();
            auVar89 = vmovdqu64_avx512f(auVar89);
            auVar90 = vpbroadcastq_avx512f();
            auVar90 = vmovdqu64_avx512f(auVar90);
            auVar91 = vpbroadcastq_avx512f();
            auVar91 = vmovdqu64_avx512f(auVar91);
            auVar92 = vpbroadcastq_avx512f();
            auVar92 = vmovdqu64_avx512f(auVar92);
            auVar93 = vpbroadcastq_avx512f();
            auVar94 = vpbroadcastq_avx512f();
            uVar56 = 0;
            auVar95 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
            do {
              auVar96 = vpbroadcastq_avx512f();
              auVar96 = vporq_avx512f(auVar96,auVar75);
              uVar51 = vpcmpuq_avx512f(auVar96,auVar74,2);
              auVar96 = vpmullq_avx512dq(auVar95,auVar76);
              vpaddq_avx512f(auVar96,auVar89);
              auVar97 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar34 * 2));
              bVar49 = (byte)uVar51;
              auVar105._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar97._8_8_;
              auVar105._0_8_ = (ulong)(bVar49 & 1) * auVar97._0_8_;
              auVar105._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar97._16_8_;
              auVar105._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar97._24_8_;
              auVar105._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar97._32_8_;
              auVar105._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar97._40_8_;
              auVar105._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar97._48_8_;
              auVar105._56_8_ = (uVar51 >> 7) * auVar97._56_8_;
              vpaddq_avx512f(auVar96,auVar90);
              auVar60 = vxorpd_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
              auVar98 = vgatherqpd_avx512f(pcVar38->jz);
              auVar62._0_8_ =
                   (ulong)(bVar49 & 1) * auVar98._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar60._0_8_;
              bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
              auVar62._8_8_ = (ulong)bVar50 * auVar98._8_8_ | (ulong)!bVar50 * auVar60._8_8_;
              auVar97._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar97._0_16_ = auVar62;
              auVar97._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar97._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar97._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar97._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar97._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar60 = vxorpd_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&ppcVar35[uVar58 - 1]->bz + (long)pcVar34));
              auVar63._0_8_ =
                   (ulong)(bVar49 & 1) * auVar98._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar60._0_8_;
              bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
              auVar63._8_8_ = (ulong)bVar50 * auVar98._8_8_ | (ulong)!bVar50 * auVar60._8_8_;
              auVar102._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar102._0_16_ = auVar63;
              auVar102._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar102._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar102._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar102._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar102._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar98 = vsubpd_avx512f(auVar97,auVar102);
              auVar99 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar37->bz + (long)pcVar34));
              auVar100._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar99._8_8_;
              auVar100._0_8_ = (ulong)(bVar49 & 1) * auVar99._0_8_;
              auVar100._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar99._16_8_;
              auVar100._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar99._24_8_;
              auVar100._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar99._32_8_;
              auVar100._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar99._40_8_;
              auVar100._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar99._48_8_;
              auVar100._56_8_ = (uVar51 >> 7) * auVar99._56_8_;
              auVar99 = vsubpd_avx512f(auVar100,auVar97);
              auVar100 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&ppcVar35[uVar58 - 2]->bz + (long)pcVar34));
              auVar101._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar100._8_8_;
              auVar101._0_8_ = (ulong)(bVar49 & 1) * auVar100._0_8_;
              auVar101._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar100._16_8_;
              auVar101._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar100._24_8_;
              auVar101._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar100._32_8_;
              auVar101._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar100._40_8_;
              auVar101._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar100._48_8_;
              auVar101._56_8_ = (uVar51 >> 7) * auVar100._56_8_;
              auVar102 = vaddpd_avx512f(auVar102,auVar99);
              auVar102 = vsubpd_avx512f(auVar102,auVar101);
              auVar60 = vxorpd_avx512vl(auVar63,auVar63);
              auVar99 = vgatherqpd_avx512f(pcVar38->jy);
              in_ZMM30._0_8_ =
                   (ulong)(bVar49 & 1) * auVar99._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar60._0_8_;
              bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
              in_ZMM30._8_8_ = (ulong)bVar50 * auVar99._8_8_ | (ulong)!bVar50 * auVar60._8_8_;
              in_ZMM30._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar99._16_8_;
              in_ZMM30._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar99._24_8_;
              in_ZMM30._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar99._32_8_;
              in_ZMM30._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar99._40_8_;
              in_ZMM30._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar99._48_8_;
              in_ZMM30._56_8_ = (uVar51 >> 7) * auVar99._56_8_;
              auVar102 = vmulpd_avx512f(auVar80,auVar102);
              auVar99 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36[-1].by + (long)pcVar34));
              auVar103._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar99._8_8_;
              auVar103._0_8_ = (ulong)(bVar49 & 1) * auVar99._0_8_;
              auVar103._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar99._16_8_;
              auVar103._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar99._24_8_;
              auVar103._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar99._32_8_;
              auVar103._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar99._40_8_;
              auVar103._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar99._48_8_;
              auVar103._56_8_ = (uVar51 >> 7) * auVar99._56_8_;
              auVar99 = vsubpd_avx512f(in_ZMM30,auVar103);
              auVar98 = vfmadd231pd_avx512f(auVar102,auVar81,auVar98);
              auVar102 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36[1].by + (long)pcVar34));
              auVar104._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar102._8_8_;
              auVar104._0_8_ = (ulong)(bVar49 & 1) * auVar102._0_8_;
              auVar104._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar102._16_8_;
              auVar104._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar102._24_8_;
              auVar104._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar102._32_8_;
              auVar104._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar102._40_8_;
              auVar104._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar102._48_8_;
              auVar104._56_8_ = (uVar51 >> 7) * auVar102._56_8_;
              auVar102 = vsubpd_avx512f(auVar104,in_ZMM30);
              auVar102 = vaddpd_avx512f(auVar103,auVar102);
              auVar105 = vfmadd213pd_avx512f(auVar98,in_ZMM17,auVar105);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36[-2].by + (long)pcVar34));
              auVar106._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar106._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar106._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar106._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar106._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar106._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar106._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar106._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar98 = vsubpd_avx512f(auVar102,auVar106);
              auVar98 = vmulpd_avx512f(auVar82,auVar98);
              auVar98 = vfmadd231pd_avx512f(auVar98,auVar83,auVar99);
              auVar105 = vfmadd213pd_avx512f(auVar98,in_ZMM19,auVar105);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar34->ex + (long)&pcVar38->jx))
              ;
              auVar99._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar99._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar99._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar99._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar99._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar99._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar99._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar99._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar105 = vfnmadd213pd_avx512f(auVar99,in_ZMM22,auVar105);
              vpaddq_avx512f(auVar96,auVar92);
              vscatterqpd_avx512f(ZEXT864(pcVar34) + ZEXT864(0) + auVar76,uVar51,auVar105);
              auVar105 = vgatherqpd_avx512f(pcVar37->bz);
              auVar98._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar105._8_8_;
              auVar98._0_8_ = (ulong)(bVar49 & 1) * auVar105._0_8_;
              auVar98._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar105._16_8_;
              auVar98._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar105._24_8_;
              auVar98._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar105._32_8_;
              auVar98._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar105._40_8_;
              auVar98._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar105._48_8_;
              auVar98._56_8_ = (uVar51 >> 7) * auVar105._56_8_;
              vpaddq_avx512f(auVar93,auVar96);
              auVar105 = vsubpd_avx512f(auVar97,auVar98);
              auVar102 = vgatherqpd_avx512f(pcVar38->jz);
              auVar107._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar102._8_8_;
              auVar107._0_8_ = (ulong)(bVar49 & 1) * auVar102._0_8_;
              auVar107._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar102._16_8_;
              auVar107._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar102._24_8_;
              auVar107._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar102._32_8_;
              auVar107._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar102._40_8_;
              auVar107._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar102._48_8_;
              auVar107._56_8_ = (uVar51 >> 7) * auVar102._56_8_;
              auVar97 = vsubpd_avx512f(auVar107,auVar97);
              vpaddq_avx512f(auVar94,auVar96);
              auVar60 = vxorpd_avx512vl(auVar62,auVar62);
              auVar97 = vaddpd_avx512f(auVar98,auVar97);
              auVar98 = vgatherqpd_avx512f(pcVar36->bz);
              auVar64._0_8_ =
                   (ulong)(bVar49 & 1) * auVar98._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar60._0_8_;
              bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
              auVar64._8_8_ = (ulong)bVar50 * auVar98._8_8_ | (ulong)!bVar50 * auVar60._8_8_;
              auVar108._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar108._0_16_ = auVar64;
              auVar108._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar108._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar108._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar108._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar108._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar97 = vsubpd_avx512f(auVar97,auVar108);
              auVar60 = vxorpd_avx512vl(auVar64,auVar64);
              auVar97 = vmulpd_avx512f(auVar84,auVar97);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar34->ex + (long)&pcVar36->bx))
              ;
              in_ZMM31._0_8_ =
                   (ulong)(bVar49 & 1) * auVar98._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar60._0_8_;
              bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
              in_ZMM31._8_8_ = (ulong)bVar50 * auVar98._8_8_ | (ulong)!bVar50 * auVar60._8_8_;
              in_ZMM31._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              in_ZMM31._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              in_ZMM31._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              in_ZMM31._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              in_ZMM31._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              in_ZMM31._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pcVar34->ex + (long)&pcVar36[-1].bx));
              auVar109._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar109._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar109._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar109._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar109._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar109._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar109._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar109._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar97 = vfmadd231pd_avx512f(auVar97,auVar85,auVar105);
              auVar105 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&pcVar34->ex + (long)&pcVar36[1].bx));
              auVar110._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar105._8_8_;
              auVar110._0_8_ = (ulong)(bVar49 & 1) * auVar105._0_8_;
              auVar110._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar105._16_8_;
              auVar110._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar105._24_8_;
              auVar110._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar105._32_8_;
              auVar110._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar105._40_8_;
              auVar110._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar105._48_8_;
              auVar110._56_8_ = (uVar51 >> 7) * auVar105._56_8_;
              auVar105 = vsubpd_avx512f(auVar110,in_ZMM31);
              auVar105 = vaddpd_avx512f(auVar109,auVar105);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pcVar34->ex + (long)&pcVar36[-2].bx));
              auVar111._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar111._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar111._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar111._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar111._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar111._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar111._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar111._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar105 = vsubpd_avx512f(auVar105,auVar111);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)(uVar58 + 8));
              auVar112._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar112._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar112._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar112._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar112._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar112._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar112._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar112._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar97 = vfmadd132pd_avx512f(auVar97,auVar112,auVar87);
              auVar98 = vsubpd_avx512f(in_ZMM31,auVar109);
              auVar105 = vmulpd_avx512f(auVar82,auVar105);
              auVar105 = vfmadd231pd_avx512f(auVar105,auVar83,auVar98);
              auVar97 = vfmadd213pd_avx512f(auVar105,auVar78,auVar97);
              vpaddq_avx512f(auVar96,auVar91);
              auVar96 = vgatherqpd_avx512f(*(undefined8 *)(uVar57 + 8));
              auVar113._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar96._8_8_;
              auVar113._0_8_ = (ulong)(bVar49 & 1) * auVar96._0_8_;
              auVar113._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar96._16_8_;
              auVar113._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar96._24_8_;
              auVar113._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar96._32_8_;
              auVar113._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar96._40_8_;
              auVar113._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar96._48_8_;
              auVar113._56_8_ = (uVar51 >> 7) * auVar96._56_8_;
              auVar96 = vfnmadd213pd_avx512f(auVar113,auVar86,auVar97);
              vscatterqpd_avx512f(ZEXT864(8) + auVar83,uVar51,auVar96);
              auVar96 = vgatherqpd_avx512f(pcVar37->by);
              auVar114._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar96._8_8_;
              auVar114._0_8_ = (ulong)(bVar49 & 1) * auVar96._0_8_;
              auVar114._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar96._16_8_;
              auVar114._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar96._24_8_;
              auVar114._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar96._32_8_;
              auVar114._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar96._40_8_;
              auVar114._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar96._48_8_;
              auVar114._56_8_ = (uVar51 >> 7) * auVar96._56_8_;
              auVar96 = vgatherqpd_avx512f(pcVar38->jy);
              auVar115._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar96._8_8_;
              auVar115._0_8_ = (ulong)(bVar49 & 1) * auVar96._0_8_;
              auVar115._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar96._16_8_;
              auVar115._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar96._24_8_;
              auVar115._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar96._32_8_;
              auVar115._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar96._40_8_;
              auVar115._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar96._48_8_;
              auVar115._56_8_ = (uVar51 >> 7) * auVar96._56_8_;
              auVar96 = vsubpd_avx512f(auVar115,in_ZMM30);
              auVar97 = vsubpd_avx512f(in_ZMM30,auVar114);
              auVar96 = vaddpd_avx512f(auVar114,auVar96);
              auVar105 = vgatherqpd_avx512f(pcVar36->by);
              auVar116._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar105._8_8_;
              auVar116._0_8_ = (ulong)(bVar49 & 1) * auVar105._0_8_;
              auVar116._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar105._16_8_;
              auVar116._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar105._24_8_;
              auVar116._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar105._32_8_;
              auVar116._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar105._40_8_;
              auVar116._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar105._48_8_;
              auVar116._56_8_ = (uVar51 >> 7) * auVar105._56_8_;
              auVar96 = vsubpd_avx512f(auVar96,auVar116);
              auVar96 = vmulpd_avx512f(auVar84,auVar96);
              auVar96 = vfmadd231pd_avx512f(auVar96,auVar85,auVar97);
              auVar97 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pcVar34->ex + (long)&ppcVar35[uVar58 - 1]->bx));
              auVar117._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar97._8_8_;
              auVar117._0_8_ = (ulong)(bVar49 & 1) * auVar97._0_8_;
              auVar117._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar97._16_8_;
              auVar117._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar97._24_8_;
              auVar117._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar97._32_8_;
              auVar117._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar97._40_8_;
              auVar117._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar97._48_8_;
              auVar117._56_8_ = (uVar51 >> 7) * auVar97._56_8_;
              auVar97 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar34->ex + (long)&pcVar37->bx))
              ;
              auVar118._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar97._8_8_;
              auVar118._0_8_ = (ulong)(bVar49 & 1) * auVar97._0_8_;
              auVar118._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar97._16_8_;
              auVar118._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar97._24_8_;
              auVar118._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar97._32_8_;
              auVar118._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar97._40_8_;
              auVar118._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar97._48_8_;
              auVar118._56_8_ = (uVar51 >> 7) * auVar97._56_8_;
              auVar97 = vsubpd_avx512f(auVar118,in_ZMM31);
              auVar105 = vsubpd_avx512f(in_ZMM31,auVar117);
              auVar97 = vaddpd_avx512f(auVar117,auVar97);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pcVar34->ex + (long)&ppcVar35[uVar58 - 2]->bx));
              auVar119._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar119._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar119._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar119._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar119._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar119._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar119._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar119._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)(uVar58 + 0x10));
              auVar120._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar98._8_8_;
              auVar120._0_8_ = (ulong)(bVar49 & 1) * auVar98._0_8_;
              auVar120._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar98._16_8_;
              auVar120._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar98._24_8_;
              auVar120._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar98._32_8_;
              auVar120._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar98._40_8_;
              auVar120._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar98._48_8_;
              auVar120._56_8_ = (uVar51 >> 7) * auVar98._56_8_;
              auVar96 = vfmadd213pd_avx512f(auVar96,auVar79,auVar120);
              auVar97 = vsubpd_avx512f(auVar97,auVar119);
              auVar97 = vmulpd_avx512f(auVar80,auVar97);
              auVar97 = vfmadd231pd_avx512f(auVar97,auVar81,auVar105);
              auVar96 = vfmadd213pd_avx512f(auVar97,in_ZMM20,auVar96);
              auVar97 = vgatherqpd_avx512f(*(undefined8 *)(uVar57 + 0x10));
              auVar121._8_8_ = (ulong)((byte)(uVar51 >> 1) & 1) * auVar97._8_8_;
              auVar121._0_8_ = (ulong)(bVar49 & 1) * auVar97._0_8_;
              auVar121._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar97._16_8_;
              auVar121._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar97._24_8_;
              auVar121._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar97._32_8_;
              auVar121._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar97._40_8_;
              auVar121._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar97._48_8_;
              auVar121._56_8_ = (uVar51 >> 7) * auVar97._56_8_;
              auVar96 = vfnmadd213pd_avx512f(auVar121,auVar88,auVar96);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar83,uVar51,auVar96);
              uVar56 = uVar56 + 8;
              auVar95 = vpaddq_avx512f(auVar95,auVar77);
              in_ZMM18 = auVar79;
            } while (((ulong)(iVar32 - 2) + 5 & 0x1fffffff8) != uVar56);
          }
          uVar58 = uVar58 + 1;
        } while (uVar58 != iVar31 - 2);
      }
      uVar57 = uVar57 + 1;
    } while (uVar57 != uVar55);
  }
  if (4 < iVar31) {
    pfVar39 = (this->super_maxwell_solver).cb;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar52._8_8_ = 0x8000000000000000;
    auVar52._0_8_ = 0x8000000000000000;
    auVar65 = vxorpd_avx512vl(auVar131,auVar52);
    auVar74 = vpbroadcastq_avx512f();
    auVar16._8_8_ = 0;
    auVar16._0_8_ = this->ay;
    auVar75 = vbroadcastsd_avx512f(auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = this->by;
    auVar76 = vbroadcastsd_avx512f(auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar77 = vbroadcastsd_avx512f(auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = this->az;
    auVar78 = vbroadcastsd_avx512f(auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = this->bz;
    auVar79 = vbroadcastsd_avx512f(auVar20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = (this->super_maxwell_solver).dx;
    auVar80 = vbroadcastsd_avx512f(auVar21);
    auVar81 = vbroadcastsd_avx512f(auVar65);
    uVar57 = 2;
    auVar82 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
    auVar83 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar84 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar85 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (4 < iVar32) {
        pcVar34 = (pfVar33->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl[1][uVar57];
        ppcVar35 = (pfVar39->p)._M_t.
                   super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                   super__Head_base<0UL,_cellb_***,_false>._M_head_impl[1];
        pcVar36 = ppcVar35[uVar57];
        pcVar37 = ppcVar35[uVar57 - 1];
        auVar86 = vpbroadcastq_avx512f();
        uVar58 = 0;
        auVar87 = vmovdqa64_avx512f(auVar82);
        do {
          auVar88 = vpbroadcastq_avx512f();
          auVar88 = vporq_avx512f(auVar88,auVar83);
          uVar56 = vpcmpuq_avx512f(auVar88,auVar74,2);
          auVar88 = vpmullq_avx512dq(auVar87,auVar84);
          auVar89 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar37->bx + (long)&pcVar34->ex));
          bVar49 = (byte)uVar56;
          auVar90._8_8_ = (ulong)((byte)(uVar56 >> 1) & 1) * auVar89._8_8_;
          auVar90._0_8_ = (ulong)(bVar49 & 1) * auVar89._0_8_;
          auVar90._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar89._16_8_;
          auVar90._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar89._24_8_;
          auVar90._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar89._32_8_;
          auVar90._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar89._40_8_;
          auVar90._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar89._48_8_;
          auVar90._56_8_ = (uVar56 >> 7) * auVar89._56_8_;
          auVar89 = vpaddq_avx512f(auVar86,auVar88);
          auVar65 = vxorpd_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar91 = vgatherqpd_avx512f((pfVar39->p)._M_t.
                                       super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>
                                       .super__Head_base<0UL,_cellb_***,_false>._M_head_impl);
          auVar92._0_8_ =
               (ulong)(bVar49 & 1) * auVar91._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar92._8_8_ = (ulong)bVar50 * auVar91._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar92._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar91._16_8_;
          auVar92._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar91._24_8_;
          auVar92._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar91._32_8_;
          auVar92._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar91._40_8_;
          auVar92._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar91._48_8_;
          auVar92._56_8_ = (uVar56 >> 7) * auVar91._56_8_;
          auVar65 = vxorpd_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar91 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar37 * 2 + 0x10));
          auVar66._0_8_ =
               (ulong)(bVar49 & 1) * auVar91._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar66._8_8_ = (ulong)bVar50 * auVar91._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar93._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar91._16_8_;
          auVar93._0_16_ = auVar66;
          auVar93._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar91._24_8_;
          auVar93._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar91._32_8_;
          auVar93._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar91._40_8_;
          auVar93._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar91._48_8_;
          auVar93._56_8_ = (uVar56 >> 7) * auVar91._56_8_;
          auVar91 = vsubpd_avx512f(auVar92,auVar93);
          auVar65 = vxorpd_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          auVar94 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&ppcVar35[uVar57 + 1]->bz + (long)pcVar37));
          in_ZMM20._0_8_ =
               (ulong)(bVar49 & 1) * auVar94._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          in_ZMM20._8_8_ = (ulong)bVar50 * auVar94._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          in_ZMM20._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar94._16_8_;
          in_ZMM20._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar94._24_8_;
          in_ZMM20._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar94._32_8_;
          in_ZMM20._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar94._40_8_;
          in_ZMM20._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar94._48_8_;
          in_ZMM20._56_8_ = (uVar56 >> 7) * auVar94._56_8_;
          auVar92 = vsubpd_avx512f(in_ZMM20,auVar92);
          auVar92 = vaddpd_avx512f(auVar93,auVar92);
          auVar65 = vxorpd_avx512vl(auVar66,auVar66);
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&ppcVar35[uVar57 - 2]->bz + (long)pcVar37));
          auVar94._0_8_ =
               (ulong)(bVar49 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar94._8_8_ = (ulong)bVar50 * auVar93._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar94._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar93._16_8_;
          auVar94._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar93._24_8_;
          auVar94._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar93._32_8_;
          auVar94._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar93._40_8_;
          auVar94._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar93._48_8_;
          auVar94._56_8_ = (uVar56 >> 7) * auVar93._56_8_;
          auVar92 = vsubpd_avx512f(auVar92,auVar94);
          auVar92 = vmulpd_avx512f(auVar75,auVar92);
          auVar92 = vfmadd231pd_avx512f(auVar92,auVar76,auVar91);
          in_ZMM17 = vfmadd213pd_avx512f(auVar92,auVar77,auVar90);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)&pfVar39->nz);
          auVar95._8_8_ = (ulong)((byte)(uVar56 >> 1) & 1) * auVar90._8_8_;
          auVar95._0_8_ = (ulong)(bVar49 & 1) * auVar90._0_8_;
          auVar95._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar90._16_8_;
          auVar95._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar90._24_8_;
          auVar95._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar90._32_8_;
          auVar95._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar90._40_8_;
          auVar95._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar90._48_8_;
          auVar95._56_8_ = (uVar56 >> 7) * auVar90._56_8_;
          auVar65 = vxorpd_avx512vl(auVar89._0_16_,auVar89._0_16_);
          auVar89 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36[-1].by + (long)pcVar37));
          auVar67._0_8_ =
               (ulong)(bVar49 & 1) * auVar89._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar67._8_8_ = (ulong)bVar50 * auVar89._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar96._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar89._16_8_;
          auVar96._0_16_ = auVar67;
          auVar96._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar89._24_8_;
          auVar96._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar89._32_8_;
          auVar96._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar89._40_8_;
          auVar96._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar89._48_8_;
          auVar96._56_8_ = (uVar56 >> 7) * auVar89._56_8_;
          in_ZMM18 = vsubpd_avx512f(auVar95,auVar96);
          auVar65 = vxorpd_avx512vl(auVar91._0_16_,auVar91._0_16_);
          auVar89 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36[1].by + (long)pcVar37));
          in_ZMM19._0_8_ =
               (ulong)(bVar49 & 1) * auVar89._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          in_ZMM19._8_8_ = (ulong)bVar50 * auVar89._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          in_ZMM19._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar89._16_8_;
          in_ZMM19._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar89._24_8_;
          in_ZMM19._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar89._32_8_;
          in_ZMM19._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar89._40_8_;
          in_ZMM19._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar89._48_8_;
          in_ZMM19._56_8_ = (uVar56 >> 7) * auVar89._56_8_;
          auVar89 = vsubpd_avx512f(in_ZMM19,auVar95);
          auVar89 = vaddpd_avx512f(auVar96,auVar89);
          auVar65 = vxorpd_avx512vl(auVar67,auVar67);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36[-2].by + (long)pcVar37));
          auVar68._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar68._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar91._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar90._16_8_;
          auVar91._0_16_ = auVar68;
          auVar91._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar90._24_8_;
          auVar91._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar90._32_8_;
          auVar91._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar90._40_8_;
          auVar91._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar90._48_8_;
          auVar91._56_8_ = (uVar56 >> 7) * auVar90._56_8_;
          auVar89 = vsubpd_avx512f(auVar89,auVar91);
          auVar89 = vmulpd_avx512f(auVar78,auVar89);
          auVar89 = vfmadd231pd_avx512f(auVar89,auVar79,in_ZMM18);
          auVar89 = vfmadd213pd_avx512f(auVar89,auVar81,in_ZMM17);
          auVar65 = vxorpd_avx512vl(auVar68,auVar68);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pcVar37->bx +
                                        (long)&(((this->super_maxwell_solver).cj)->p)._M_t.
                                               super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                               .super__Head_base<0UL,_cellj_***,_false>._M_head_impl
                                               [1][uVar57]->jx));
          auVar122._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar56 >> 1) & 1);
          auVar122._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar122._16_8_ = (ulong)((byte)(uVar56 >> 2) & 1) * auVar90._16_8_;
          auVar122._24_8_ = (ulong)((byte)(uVar56 >> 3) & 1) * auVar90._24_8_;
          auVar122._32_8_ = (ulong)((byte)(uVar56 >> 4) & 1) * auVar90._32_8_;
          auVar122._40_8_ = (ulong)((byte)(uVar56 >> 5) & 1) * auVar90._40_8_;
          auVar122._48_8_ = (ulong)((byte)(uVar56 >> 6) & 1) * auVar90._48_8_;
          auVar122._56_8_ = (uVar56 >> 7) * auVar90._56_8_;
          auVar89 = vfnmadd213pd_avx512f(auVar122,auVar80,auVar89);
          vscatterqpd_avx512f(ZEXT864(pcVar34) + auVar88,uVar56,auVar89);
          uVar58 = uVar58 + 8;
          auVar87 = vpaddq_avx512f(auVar87,auVar85);
        } while (((ulong)(iVar32 - 2) + 5 & 0x1fffffff8) != uVar58);
      }
      uVar57 = uVar57 + 1;
    } while (uVar57 != iVar31 - 2);
  }
  if (4 < iVar30) {
    pfVar39 = (this->super_maxwell_solver).cb;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar53._8_8_ = 0x8000000000000000;
    auVar53._0_8_ = 0x8000000000000000;
    auVar65 = vxorpd_avx512vl(auVar132,auVar53);
    uVar57 = (ulong)(iVar32 - 2) + 5 & 0x1fffffff8;
    auVar74 = vpbroadcastq_avx512f();
    auVar22._8_8_ = 0;
    auVar22._0_8_ = this->ax;
    auVar75 = vbroadcastsd_avx512f(auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = this->bx;
    auVar76 = vbroadcastsd_avx512f(auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = this->az;
    auVar77 = vbroadcastsd_avx512f(auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = this->bz;
    auVar78 = vbroadcastsd_avx512f(auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar79 = vbroadcastsd_avx512f(auVar26);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = (this->super_maxwell_solver).dy;
    auVar80 = vbroadcastsd_avx512f(auVar27);
    auVar81 = vbroadcastsd_avx512f(auVar65);
    uVar58 = 2;
    auVar82 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
    auVar83 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar84 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar85 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      if (4 < iVar32) {
        pppcVar40 = (pfVar39->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        pcVar37 = pppcVar40[uVar58][1];
        pcVar36 = pcVar37 + -1;
        auVar86 = vpbroadcastq_avx512f();
        auVar87 = vpbroadcastq_avx512f();
        uVar56 = 0;
        auVar88 = vmovdqa64_avx512f(auVar82);
        do {
          auVar89 = vpbroadcastq_avx512f();
          auVar89 = vporq_avx512f(auVar89,auVar83);
          uVar51 = vpcmpuq_avx512f(auVar89,auVar74,2);
          auVar89 = vpmullq_avx512dq(auVar88,auVar84);
          vpaddq_avx512f(auVar86,auVar89);
          auVar65 = vxorpd_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)&pfVar39->nz);
          bVar49 = (byte)uVar51;
          auVar69._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar69._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar123._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar90._16_8_;
          auVar123._0_16_ = auVar69;
          auVar123._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar90._24_8_;
          auVar123._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar90._32_8_;
          auVar123._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar90._40_8_;
          auVar123._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar90._48_8_;
          auVar123._56_8_ = (uVar51 >> 7) * auVar90._56_8_;
          auVar89 = vpaddq_avx512f(auVar87,auVar89);
          auVar65 = vxorpd_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)(uVar57 + 0x10));
          auVar124._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar124._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar124._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar90._16_8_;
          auVar124._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar90._24_8_;
          auVar124._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar90._32_8_;
          auVar124._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar90._40_8_;
          auVar124._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar90._48_8_;
          auVar124._56_8_ = (uVar51 >> 7) * auVar90._56_8_;
          auVar65 = vxorpd_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pppcVar40[uVar58 - 1][1]->bz + (long)pcVar36));
          auVar70._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar70._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar125._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar90._16_8_;
          auVar125._0_16_ = auVar70;
          auVar125._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar90._24_8_;
          auVar125._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar90._32_8_;
          auVar125._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar90._40_8_;
          auVar125._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar90._48_8_;
          auVar125._56_8_ = (uVar51 >> 7) * auVar90._56_8_;
          auVar90 = vsubpd_avx512f(auVar124,auVar125);
          auVar65 = vxorpd_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          auVar91 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pppcVar40[uVar58 + 1][1]->bz + (long)pcVar36));
          auVar71._0_8_ =
               (ulong)(bVar49 & 1) * auVar91._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar71._8_8_ = (ulong)bVar50 * auVar91._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar126._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar91._16_8_;
          auVar126._0_16_ = auVar71;
          auVar126._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar91._24_8_;
          auVar126._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar91._32_8_;
          auVar126._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar91._40_8_;
          auVar126._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar91._48_8_;
          auVar126._56_8_ = (uVar51 >> 7) * auVar91._56_8_;
          auVar91 = vsubpd_avx512f(auVar126,auVar124);
          auVar91 = vaddpd_avx512f(auVar125,auVar91);
          auVar65 = vxorpd_avx512vl(auVar70,auVar70);
          auVar92 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pppcVar40[uVar58 - 2][1]->bz + (long)pcVar36));
          auVar72._0_8_ =
               (ulong)(bVar49 & 1) * auVar92._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar72._8_8_ = (ulong)bVar50 * auVar92._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar127._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar92._16_8_;
          auVar127._0_16_ = auVar72;
          auVar127._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar92._24_8_;
          auVar127._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar92._32_8_;
          auVar127._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar92._40_8_;
          auVar127._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar92._48_8_;
          auVar127._56_8_ = (uVar51 >> 7) * auVar92._56_8_;
          auVar91 = vsubpd_avx512f(auVar91,auVar127);
          auVar91 = vmulpd_avx512f(auVar75,auVar91);
          auVar90 = vfmadd231pd_avx512f(auVar91,auVar76,auVar90);
          in_ZMM19 = vfmadd213pd_avx512f(auVar90,auVar81,auVar123);
          auVar65 = vxorpd_avx512vl(auVar69,auVar69);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36->bx + (long)&pcVar37->bx));
          auVar128._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar128._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar128._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar90._16_8_;
          auVar128._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar90._24_8_;
          auVar128._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar90._32_8_;
          auVar128._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar90._40_8_;
          auVar128._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar90._48_8_;
          auVar128._56_8_ = (uVar51 >> 7) * auVar90._56_8_;
          auVar65 = vxorpd_avx512vl(auVar72,auVar72);
          auVar90 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar36 * 2));
          auVar73._0_8_ =
               (ulong)(bVar49 & 1) * auVar90._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar73._8_8_ = (ulong)bVar50 * auVar90._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar129._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar90._16_8_;
          auVar129._0_16_ = auVar73;
          auVar129._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar90._24_8_;
          auVar129._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar90._32_8_;
          auVar129._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar90._40_8_;
          auVar129._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar90._48_8_;
          auVar129._56_8_ = (uVar51 >> 7) * auVar90._56_8_;
          auVar90 = vsubpd_avx512f(auVar128,auVar129);
          auVar65 = vxorpd_avx512vl(auVar71,auVar71);
          auVar91 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar36->bx + (long)&pcVar37[1].bx));
          in_ZMM22._0_8_ =
               (ulong)(bVar49 & 1) * auVar91._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          in_ZMM22._8_8_ = (ulong)bVar50 * auVar91._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          in_ZMM22._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar91._16_8_;
          in_ZMM22._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar91._24_8_;
          in_ZMM22._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar91._32_8_;
          in_ZMM22._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar91._40_8_;
          in_ZMM22._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar91._48_8_;
          in_ZMM22._56_8_ = (uVar51 >> 7) * auVar91._56_8_;
          auVar91 = vsubpd_avx512f(in_ZMM22,auVar128);
          auVar91 = vaddpd_avx512f(auVar129,auVar91);
          auVar65 = vxorpd_avx512vl(auVar73,auVar73);
          auVar92 = vgatherqpd_avx512f(*(undefined8 *)(uVar57 - 0x30));
          in_ZMM20._0_8_ =
               (ulong)(bVar49 & 1) * auVar92._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          in_ZMM20._8_8_ = (ulong)bVar50 * auVar92._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          in_ZMM20._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar92._16_8_;
          in_ZMM20._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar92._24_8_;
          in_ZMM20._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar92._32_8_;
          in_ZMM20._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar92._40_8_;
          in_ZMM20._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar92._48_8_;
          in_ZMM20._56_8_ = (uVar51 >> 7) * auVar92._56_8_;
          auVar91 = vsubpd_avx512f(auVar91,in_ZMM20);
          auVar91 = vmulpd_avx512f(auVar77,auVar91);
          auVar90 = vfmadd231pd_avx512f(auVar91,auVar78,auVar90);
          in_ZMM17 = vfmadd213pd_avx512f(auVar90,auVar79,in_ZMM19);
          auVar65 = vxorpd_avx512vl(auVar89._0_16_,auVar89._0_16_);
          auVar89 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(((this->super_maxwell_solver).cj)->p)._M_t.
                                                super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                .super__Head_base<0UL,_cellj_***,_false>.
                                                _M_head_impl[uVar58][1]->jy + (long)pcVar36));
          auVar130._0_8_ =
               (ulong)(bVar49 & 1) * auVar89._0_8_ | (ulong)!(bool)(bVar49 & 1) * auVar65._0_8_;
          bVar50 = (bool)((byte)(uVar51 >> 1) & 1);
          auVar130._8_8_ = (ulong)bVar50 * auVar89._8_8_ | (ulong)!bVar50 * auVar65._8_8_;
          auVar130._16_8_ = (ulong)((byte)(uVar51 >> 2) & 1) * auVar89._16_8_;
          auVar130._24_8_ = (ulong)((byte)(uVar51 >> 3) & 1) * auVar89._24_8_;
          auVar130._32_8_ = (ulong)((byte)(uVar51 >> 4) & 1) * auVar89._32_8_;
          auVar130._40_8_ = (ulong)((byte)(uVar51 >> 5) & 1) * auVar89._40_8_;
          auVar130._48_8_ = (ulong)((byte)(uVar51 >> 6) & 1) * auVar89._48_8_;
          auVar130._56_8_ = (uVar51 >> 7) * auVar89._56_8_;
          auVar89 = vfnmadd213pd_avx512f(auVar130,auVar80,in_ZMM17);
          vscatterqpd_avx512f(ZEXT864(8) + auVar74,uVar51,auVar89);
          uVar56 = uVar56 + 8;
          auVar88 = vpaddq_avx512f(auVar88,auVar85);
        } while (uVar57 != uVar56);
      }
      uVar58 = uVar58 + 1;
    } while (uVar58 != uVar55);
  }
  if (4 < iVar30) {
    auVar133._8_8_ = 0;
    auVar133._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = this->bx;
    pfVar39 = (this->super_maxwell_solver).cb;
    pfVar41 = (this->super_maxwell_solver).cj;
    dVar1 = this->ax;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = this->by;
    dVar2 = this->ay;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar54._8_8_ = 0x8000000000000000;
    auVar54._0_8_ = 0x8000000000000000;
    auVar65 = vxorpd_avx512vl(auVar137,auVar54);
    auVar138._8_8_ = 0;
    auVar138._0_8_ = (this->super_maxwell_solver).dz;
    uVar57 = 2;
    do {
      if (4 < iVar31) {
        ppcVar42 = (pfVar33->p)._M_t.
                   super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                   super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar57];
        pppcVar40 = (pfVar39->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        ppcVar35 = pppcVar40[uVar57];
        ppcVar43 = pppcVar40[uVar57 - 2];
        ppcVar44 = pppcVar40[uVar57 - 1];
        ppcVar45 = pppcVar40[uVar57 + 1];
        ppcVar46 = (pfVar41->p)._M_t.
                   super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                   super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar57];
        lVar59 = 0;
        do {
          lVar47 = *(long *)((long)ppcVar42 + lVar59 + 0x10);
          lVar48 = *(long *)((long)ppcVar35 + lVar59 + 0x10);
          dVar3 = *(double *)(lVar48 + 0x18);
          dVar4 = *(double *)(lVar48 + 0x20);
          dVar5 = *(double *)(*(long *)((long)ppcVar44 + lVar59 + 0x10) + 0x20);
          auVar140._8_8_ = 0;
          auVar140._0_8_ =
               ((dVar5 + (*(double *)(*(long *)((long)ppcVar45 + lVar59 + 0x10) + 0x20) - dVar4)) -
               *(double *)(*(long *)((long)ppcVar43 + lVar59 + 0x10) + 0x20)) * dVar1;
          auVar141._8_8_ = 0;
          auVar141._0_8_ = dVar4 - dVar5;
          auVar60 = vfmadd231sd_fma(auVar140,auVar135,auVar141);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(lVar47 + 0x28);
          auVar60 = vfmadd213sd_fma(auVar60,auVar133,auVar28);
          dVar4 = *(double *)(*(long *)((long)ppcVar35 + lVar59 + 8) + 0x18);
          auVar139._8_8_ = 0;
          auVar139._0_8_ =
               dVar2 * ((dVar4 + (*(double *)(*(long *)((long)ppcVar35 + lVar59 + 0x18) + 0x18) -
                                 dVar3)) - *(double *)(*(long *)((long)ppcVar35 + lVar59) + 0x18));
          auVar142._8_8_ = 0;
          auVar142._0_8_ = dVar3 - dVar4;
          auVar61 = vfmadd231sd_fma(auVar139,auVar136,auVar142);
          auVar60 = vfmadd213sd_fma(auVar61,auVar65,auVar60);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(*(long *)((long)ppcVar46 + lVar59 + 0x10) + 0x28);
          auVar60 = vfnmadd231sd_fma(auVar60,auVar138,auVar29);
          *(long *)(lVar47 + 0x28) = auVar60._0_8_;
          lVar59 = lVar59 + 8;
        } while ((ulong)(iVar31 - 2) * 8 + -0x10 != lVar59);
      }
      uVar57 = uVar57 + 1;
    } while (uVar57 != uVar55);
  }
  return;
}

Assistant:

void five_point_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;

                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;

                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=1;
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        {int j=1;
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            {int k=1;
                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
}